

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1109b::FragmentURITest_ParseRangeEmpty_Test::
~FragmentURITest_ParseRangeEmpty_Test(FragmentURITest_ParseRangeEmpty_Test *this)

{
  void *in_RDI;
  
  ~FragmentURITest_ParseRangeEmpty_Test((FragmentURITest_ParseRangeEmpty_Test *)0x126918);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST_F(FragmentURITest, ParseRangeEmpty) {
    EXPECT_EQ(ktx::parseFragmentURI("m=").mip, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("a=").stratal, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("f=").facial, ktx::SelectorRange(ktx::all));

    EXPECT_EQ(ktx::parseFragmentURI("m=,").mip, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("a=,").stratal, ktx::SelectorRange(ktx::all));
    EXPECT_EQ(ktx::parseFragmentURI("f=,").facial, ktx::SelectorRange(ktx::all));
}